

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picojson.h
# Opt level: O0

bool __thiscall picojson::default_parse_context::parse_array_start(default_parse_context *this)

{
  value local_20;
  default_parse_context *local_10;
  default_parse_context *this_local;
  
  local_10 = this;
  value::value(&local_20,4,false);
  value::operator=(this->out_,&local_20);
  value::~value(&local_20);
  return true;
}

Assistant:

bool parse_array_start() {
    *out_ = value(array_type, false);
    return true;
  }